

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

void process_restart(j_decompress_ptr cinfo)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  jpeg_component_info *compptr;
  int ci;
  arith_entropy_ptr_conflict entropy;
  int local_14;
  
  lVar1 = in_RDI[0x4a];
  iVar3 = (**(code **)(in_RDI[0x49] + 0x10))(in_RDI);
  if (iVar3 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x18;
    (**(code **)*in_RDI)(in_RDI);
  }
  for (local_14 = 0; local_14 < (int)in_RDI[0x36]; local_14 = local_14 + 1) {
    lVar2 = in_RDI[(long)local_14 + 0x37];
    if (((int)in_RDI[0x27] == 0) ||
       ((*(int *)((long)in_RDI + 0x20c) == 0 && (*(int *)((long)in_RDI + 0x214) == 0)))) {
      memset(*(void **)(lVar1 + 0x50 + (long)*(int *)(lVar2 + 0x14) * 8),0,0x40);
      *(undefined4 *)(lVar1 + 0x2c + (long)local_14 * 4) = 0;
      *(undefined4 *)(lVar1 + 0x3c + (long)local_14 * 4) = 0;
    }
    if (((int)in_RDI[0x27] == 0) || (*(int *)((long)in_RDI + 0x20c) != 0)) {
      memset(*(void **)(lVar1 + 0xd0 + (long)*(int *)(lVar2 + 0x18) * 8),0,0x100);
    }
  }
  *(undefined8 *)(lVar1 + 0x18) = 0;
  *(undefined8 *)(lVar1 + 0x20) = 0;
  *(undefined4 *)(lVar1 + 0x28) = 0xfffffff0;
  *(int *)(lVar1 + 0x4c) = (int)in_RDI[0x2e];
  return;
}

Assistant:

LOCAL(boolean)
process_restart(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (!(*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->pub.insufficient_data = FALSE;

  return TRUE;
}